

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>
::
Intrusive_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::vector<int,std::allocator<int>>>
          (Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>
           *this,Index columnIndex,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *nonZeroRowIndices,vector<int,_std::allocator<int>_> *rowContainer,
          Column_settings *colSettings)

{
  ID_index rowIndex;
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  uint pivot;
  size_type sVar2;
  unsigned_long local_88;
  undefined1 local_68 [24];
  pair<unsigned_int,_unsigned_int> *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range4;
  Column_settings *local_30;
  Column_settings *colSettings_local;
  vector<int,_std::allocator<int>_> *rowContainer_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *nonZeroRowIndices_local;
  Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>
  *pIStack_10;
  Index columnIndex_local;
  Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  *this_local;
  
  local_30 = colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local = (vector<int,_std::allocator<int>_> *)nonZeroRowIndices;
  nonZeroRowIndices_local._4_4_ = columnIndex;
  pIStack_10 = this;
  Dummy_row_access::Dummy_row_access<unsigned_int,std::vector<int,std::allocator<int>>*>
            ((Dummy_row_access *)this,columnIndex,
             (vector<int,_std::allocator<int>_> **)&colSettings_local);
  sVar2 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)rowContainer_local);
  if (sVar2 == 0) {
    local_88 = 0;
  }
  else {
    sVar2 = std::
            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)rowContainer_local);
    local_88 = sVar2 - 1;
  }
  Dummy_dimension_holder::Dummy_dimension_holder<unsigned_long>
            ((Dummy_dimension_holder *)this,local_88);
  __range4 = (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)rowContainer_local;
  pivot = Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
          ::
          Intrusive_set_column<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::vector<int,_std::allocator<int>_>_>
          ::anon_class_8_1_c18eeb02::operator()((anon_class_8_1_c18eeb02 *)&__range4);
  Dummy_chain_properties::Dummy_chain_properties((Dummy_chain_properties *)this,pivot,0);
  boost::intrusive::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::set_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::set((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::set_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
         *)this);
  this_00 = rowContainer_local;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined1 **)(this + 0x28) = &local_30->field_0x20;
  *(Column_settings **)(this + 0x20) = local_30;
  __end0 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)rowContainer_local);
  p = (pair<unsigned_int,_unsigned_int> *)
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&p);
    if (!bVar1) break;
    local_68._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::operator*(&__end0);
    local_68._12_4_ =
         persistence_fields::Zp_field_operators<unsigned_int,_void>::get_value
                   (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x20),
                    *(uint *)((long)&((node_ptr)local_68._16_8_)->parent_ + 4));
    rowIndex = *(ID_index *)(node_ptr *)local_68._16_8_;
    boost::intrusive::
    bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    ::end((bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
           *)local_68);
    Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
    ::_insert_entry((Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                     *)this,(Field_element *)(local_68 + 0xc),rowIndex,(iterator *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Intrusive_set_column<Master_matrix>::Intrusive_set_column(Index columnIndex,
                                                                 const Container& nonZeroRowIndices,
                                                                 Row_container* rowContainer,
                                                                 Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}